

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O2

string * __thiscall
VulkanUtilities::VkAccessFlagsToString_abi_cxx11_
          (string *__return_storage_ptr__,VulkanUtilities *this,VkAccessFlags Flags)

{
  VkAccessFlagBits VVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (ulong)this & 0xffffffff;
  while (VVar1 = (VkAccessFlagBits)uVar2, VVar1 != VK_ACCESS_NONE) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    VkAccessFlagBitToString(-VVar1 & VVar1);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (ulong)(VVar1 - VK_ACCESS_INDIRECT_COMMAND_READ_BIT & VVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VkAccessFlagsToString(VkAccessFlags Flags)
{
    std::string FlagsString;
    while (Flags != 0)
    {
        auto Bit = Flags & ~(Flags - 1);
        if (!FlagsString.empty())
            FlagsString += ", ";
        FlagsString += VkAccessFlagBitToString(static_cast<VkAccessFlagBits>(Bit));
        Flags = Flags & (Flags - 1);
    }
    return FlagsString;
}